

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

void png_do_expand(png_row_infop row_info,png_bytep row,png_const_color_16p trans_color)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  png_uint_16 pVar5;
  png_uint_16 pVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  png_uint_16 pVar11;
  size_t sVar12;
  byte *pbVar13;
  ulong uVar14;
  png_byte pVar15;
  bool bVar16;
  
  uVar4 = row_info->width;
  uVar9 = (ulong)uVar4;
  if (row_info->color_type == '\0') {
    if (trans_color == (png_const_color_16p)0x0) {
      pVar11 = 0;
    }
    else {
      pVar11 = trans_color->gray;
    }
    bVar7 = row_info->bit_depth;
    if (bVar7 < 8) {
      if (bVar7 == 1) {
        pbVar13 = row + (uVar4 - 1 >> 3);
        uVar8 = -uVar4 & 7;
        for (uVar14 = uVar9; (int)uVar14 != 0; uVar14 = uVar14 - 1) {
          row[uVar14 - 1] = -((*pbVar13 >> (uVar8 & 0x1f) & 1) != 0);
          bVar16 = uVar8 == 7;
          uVar8 = uVar8 + 1;
          if (bVar16) {
            uVar8 = 0;
          }
          pbVar13 = pbVar13 + -(ulong)bVar16;
        }
        uVar1 = pVar11 & 1;
        pVar11 = 0xff;
        if (uVar1 == 0) {
          pVar11 = 0;
        }
      }
      else if (bVar7 == 2) {
        pbVar13 = row + (uVar4 - 1 >> 2);
        uVar8 = ~(uVar4 * 2 + 6) & 6;
        for (uVar14 = uVar9; (int)uVar14 != 0; uVar14 = uVar14 - 1) {
          row[uVar14 - 1] = (*pbVar13 >> ((byte)uVar8 & 0x1f) & 3) * 'U';
          bVar16 = uVar8 == 6;
          uVar8 = uVar8 + 2;
          if (bVar16) {
            uVar8 = 0;
          }
          pbVar13 = pbVar13 + -(ulong)bVar16;
        }
        pVar11 = (pVar11 & 3) * 0x55;
      }
      else if (bVar7 == 4) {
        pbVar13 = row + (uVar4 - 1 >> 1);
        uVar8 = uVar4 * 4 & 4;
        for (uVar14 = uVar9; (int)uVar14 != 0; uVar14 = uVar14 - 1) {
          bVar7 = *pbVar13 >> (sbyte)uVar8;
          row[uVar14 - 1] = bVar7 << 4 | bVar7 & 0xf;
          pbVar13 = pbVar13 + -(ulong)(uVar8 != 0);
          uVar8 = (uint)(uVar8 == 0) << 2;
        }
        pVar11 = (pVar11 & 0xf) * 0x11;
      }
      bVar7 = 8;
      row_info->bit_depth = '\b';
      row_info->pixel_depth = '\b';
      row_info->rowbytes = uVar9;
    }
    if (trans_color == (png_const_color_16p)0x0) {
      return;
    }
    if (bVar7 == 0x10) {
      sVar12 = row_info->rowbytes;
      for (lVar10 = 0; -uVar4 != (int)lVar10; lVar10 = lVar10 + -1) {
        if ((row[lVar10 * 2 + (sVar12 - 2)] == (png_byte)(pVar11 >> 8)) &&
           (row[lVar10 * 2 + (sVar12 - 1)] == (png_byte)pVar11)) {
          pVar15 = '\0';
        }
        else {
          pVar15 = 0xff;
        }
        row[lVar10 * 4 + sVar12 * 2 + -1] = pVar15;
        row[lVar10 * 4 + sVar12 * 2 + -2] = pVar15;
        row[lVar10 * 4 + sVar12 * 2 + -3] = row[lVar10 * 2 + (sVar12 - 1)];
        row[lVar10 * 4 + sVar12 * 2 + -4] = row[lVar10 * 2 + (sVar12 - 2)];
      }
    }
    else {
      uVar14 = uVar9;
      if (bVar7 == 8) {
        for (; (int)uVar14 != 0; uVar14 = uVar14 - 1) {
          row[uVar14 * 2 + -1] = -(row[uVar14 - 1] != (png_byte)pVar11);
          row[uVar14 * 2 + -2] = row[uVar14 - 1];
        }
      }
    }
    row_info->color_type = '\x04';
    row_info->channels = '\x02';
    bVar7 = row_info->bit_depth * '\x02';
  }
  else {
    if (trans_color == (png_const_color_16p)0x0 || row_info->color_type != '\x02') {
      return;
    }
    if (row_info->bit_depth == '\x10') {
      uVar1 = trans_color->red;
      uVar2 = trans_color->green;
      uVar3 = trans_color->blue;
      lVar10 = row_info->rowbytes - 1;
      for (uVar14 = uVar9; (int)uVar14 != 0; uVar14 = uVar14 - 1) {
        if (((((uVar1 >> 8 == (ushort)row[lVar10 + -5]) && (row[lVar10 + -4] == (png_byte)uVar1)) &&
             (uVar2 >> 8 == (ushort)row[lVar10 + -3])) &&
            ((row[lVar10 + -2] == (png_byte)uVar2 && (uVar3 >> 8 == (ushort)row[lVar10 + -1])))) &&
           (row[lVar10] == (png_byte)uVar3)) {
          pVar15 = '\0';
        }
        else {
          pVar15 = 0xff;
        }
        row[uVar14 * 8 + -1] = pVar15;
        row[uVar14 * 8 + -2] = pVar15;
        row[uVar14 * 8 + -3] = row[lVar10];
        row[uVar14 * 8 + -4] = row[lVar10 + -1];
        row[uVar14 * 8 + -5] = row[lVar10 + -2];
        row[uVar14 * 8 + -6] = row[lVar10 + -3];
        row[uVar14 * 8 + -7] = row[lVar10 + -4];
        row[uVar14 * 8 + -8] = row[lVar10 + -5];
        lVar10 = lVar10 + -6;
      }
    }
    else if (row_info->bit_depth == '\b') {
      pVar11 = trans_color->red;
      pVar5 = trans_color->green;
      pVar6 = trans_color->blue;
      sVar12 = row_info->rowbytes;
      for (uVar14 = uVar9; (int)uVar14 != 0; uVar14 = uVar14 - 1) {
        if (((row[sVar12 - 3] == (png_byte)pVar11) && (row[sVar12 - 2] == (png_byte)pVar5)) &&
           (row[sVar12 - 1] == (png_byte)pVar6)) {
          pVar15 = '\0';
        }
        else {
          pVar15 = 0xff;
        }
        row[uVar14 * 4 + -1] = pVar15;
        row[uVar14 * 4 + -2] = row[sVar12 - 1];
        row[uVar14 * 4 + -3] = row[sVar12 - 2];
        row[uVar14 * 4 + -4] = row[sVar12 - 3];
        sVar12 = sVar12 - 3;
      }
    }
    row_info->color_type = '\x06';
    row_info->channels = '\x04';
    bVar7 = row_info->bit_depth << 2;
  }
  row_info->pixel_depth = bVar7;
  if (bVar7 < 8) {
    uVar9 = bVar7 * uVar9 + 7 >> 3;
  }
  else {
    uVar9 = (bVar7 >> 3) * uVar9;
  }
  row_info->rowbytes = uVar9;
  return;
}

Assistant:

static void
png_do_expand(png_row_infop row_info, png_bytep row,
    png_const_color_16p trans_color)
{
   int shift, value;
   png_bytep sp, dp;
   png_uint_32 i;
   png_uint_32 row_width=row_info->width;

   png_debug(1, "in png_do_expand");

   if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
   {
      unsigned int gray = trans_color != NULL ? trans_color->gray : 0;

      if (row_info->bit_depth < 8)
      {
         switch (row_info->bit_depth)
         {
            case 1:
            {
               gray = (gray & 0x01) * 0xff;
               sp = row + (size_t)((row_width - 1) >> 3);
               dp = row + (size_t)row_width - 1;
               shift = 7 - (int)((row_width + 7) & 0x07);
               for (i = 0; i < row_width; i++)
               {
                  if ((*sp >> shift) & 0x01)
                     *dp = 0xff;

                  else
                     *dp = 0;

                  if (shift == 7)
                  {
                     shift = 0;
                     sp--;
                  }

                  else
                     shift++;

                  dp--;
               }
               break;
            }

            case 2:
            {
               gray = (gray & 0x03) * 0x55;
               sp = row + (size_t)((row_width - 1) >> 2);
               dp = row + (size_t)row_width - 1;
               shift = (int)((3 - ((row_width + 3) & 0x03)) << 1);
               for (i = 0; i < row_width; i++)
               {
                  value = (*sp >> shift) & 0x03;
                  *dp = (png_byte)(value | (value << 2) | (value << 4) |
                     (value << 6));
                  if (shift == 6)
                  {
                     shift = 0;
                     sp--;
                  }

                  else
                     shift += 2;

                  dp--;
               }
               break;
            }

            case 4:
            {
               gray = (gray & 0x0f) * 0x11;
               sp = row + (size_t)((row_width - 1) >> 1);
               dp = row + (size_t)row_width - 1;
               shift = (int)((1 - ((row_width + 1) & 0x01)) << 2);
               for (i = 0; i < row_width; i++)
               {
                  value = (*sp >> shift) & 0x0f;
                  *dp = (png_byte)(value | (value << 4));
                  if (shift == 4)
                  {
                     shift = 0;
                     sp--;
                  }

                  else
                     shift = 4;

                  dp--;
               }
               break;
            }

            default:
               break;
         }

         row_info->bit_depth = 8;
         row_info->pixel_depth = 8;
         row_info->rowbytes = row_width;
      }

      if (trans_color != NULL)
      {
         if (row_info->bit_depth == 8)
         {
            gray = gray & 0xff;
            sp = row + (size_t)row_width - 1;
            dp = row + ((size_t)row_width << 1) - 1;

            for (i = 0; i < row_width; i++)
            {
               if ((*sp & 0xffU) == gray)
                  *dp-- = 0;

               else
                  *dp-- = 0xff;

               *dp-- = *sp--;
            }
         }

         else if (row_info->bit_depth == 16)
         {
            unsigned int gray_high = (gray >> 8) & 0xff;
            unsigned int gray_low = gray & 0xff;
            sp = row + row_info->rowbytes - 1;
            dp = row + (row_info->rowbytes << 1) - 1;
            for (i = 0; i < row_width; i++)
            {
               if ((*(sp - 1) & 0xffU) == gray_high &&
                   (*(sp) & 0xffU) == gray_low)
               {
                  *dp-- = 0;
                  *dp-- = 0;
               }

               else
               {
                  *dp-- = 0xff;
                  *dp-- = 0xff;
               }

               *dp-- = *sp--;
               *dp-- = *sp--;
            }
         }

         row_info->color_type = PNG_COLOR_TYPE_GRAY_ALPHA;
         row_info->channels = 2;
         row_info->pixel_depth = (png_byte)(row_info->bit_depth << 1);
         row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
             row_width);
      }
   }
   else if (row_info->color_type == PNG_COLOR_TYPE_RGB &&
       trans_color != NULL)
   {
      if (row_info->bit_depth == 8)
      {
         png_byte red = (png_byte)(trans_color->red & 0xff);
         png_byte green = (png_byte)(trans_color->green & 0xff);
         png_byte blue = (png_byte)(trans_color->blue & 0xff);
         sp = row + (size_t)row_info->rowbytes - 1;
         dp = row + ((size_t)row_width << 2) - 1;
         for (i = 0; i < row_width; i++)
         {
            if (*(sp - 2) == red && *(sp - 1) == green && *(sp) == blue)
               *dp-- = 0;

            else
               *dp-- = 0xff;

            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
         }
      }
      else if (row_info->bit_depth == 16)
      {
         png_byte red_high = (png_byte)((trans_color->red >> 8) & 0xff);
         png_byte green_high = (png_byte)((trans_color->green >> 8) & 0xff);
         png_byte blue_high = (png_byte)((trans_color->blue >> 8) & 0xff);
         png_byte red_low = (png_byte)(trans_color->red & 0xff);
         png_byte green_low = (png_byte)(trans_color->green & 0xff);
         png_byte blue_low = (png_byte)(trans_color->blue & 0xff);
         sp = row + row_info->rowbytes - 1;
         dp = row + ((size_t)row_width << 3) - 1;
         for (i = 0; i < row_width; i++)
         {
            if (*(sp - 5) == red_high &&
                *(sp - 4) == red_low &&
                *(sp - 3) == green_high &&
                *(sp - 2) == green_low &&
                *(sp - 1) == blue_high &&
                *(sp    ) == blue_low)
            {
               *dp-- = 0;
               *dp-- = 0;
            }

            else
            {
               *dp-- = 0xff;
               *dp-- = 0xff;
            }

            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
         }
      }
      row_info->color_type = PNG_COLOR_TYPE_RGB_ALPHA;
      row_info->channels = 4;
      row_info->pixel_depth = (png_byte)(row_info->bit_depth << 2);
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
   }
}